

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_world_ego(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if (*(int *)((long)*(int *)((long)pvVar2 + 0x10) * 0x50 + -0x4c + *(long *)((long)pvVar2 + 0x18)
                ) != 0) {
      __assert_fail("map->levels[map->num_levels - 1].depth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0x46d,"enum parser_error parse_world_ego(struct parser *)");
    }
    if (*(int *)(*(long *)((long)pvVar2 + 0x20) + -0x28 + (long)*(int *)((long)pvVar2 + 0x14) * 0x28
                ) != *(int *)((long)pvVar2 + 0x10) + -1) {
      __assert_fail("map->towns[map->num_towns - 1].index == map->num_levels - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0x46e,"enum parser_error parse_world_ego(struct parser *)");
    }
    pcVar3 = parser_getstr(p,"name");
    pcVar3 = string_make(pcVar3);
    *(char **)(*(long *)((long)pvVar2 + 0x20) + -0x18 + (long)*(int *)((long)pvVar2 + 0x14) * 0x28)
         = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_world_ego(struct parser *p) {
	struct level_map *map = parser_priv(p);
	const char *name;

	if (!map)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	assert(map->levels[map->num_levels - 1].depth == 0);
	assert(map->towns[map->num_towns - 1].index == map->num_levels - 1);
	name = parser_getstr(p, "name");
	map->towns[map->num_towns - 1].ego = string_make(name);
	return PARSE_ERROR_NONE;
}